

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scspdsp.c
# Opt level: O3

void SCSPDSP_Start(SCSPDSP *DSP)

{
  int iVar1;
  long lVar2;
  
  DSP->Stopped = 0;
  lVar2 = 0;
  while (((((short)DSP->TEMP[lVar2 * 2 + -2] == 0 &&
           (*(short *)((long)DSP->TEMP + lVar2 * 8 + -6) == 0)) &&
          ((short)DSP->TEMP[lVar2 * 2 + -1] == 0)) &&
         (*(short *)((long)DSP->TEMP + lVar2 * 8 + -2) == 0))) {
    lVar2 = lVar2 + -1;
    if (lVar2 == -0x80) {
      iVar1 = -1;
LAB_0016ed4d:
      DSP->LastStep = iVar1 + 1;
      return;
    }
  }
  iVar1 = (int)lVar2 + 0x7f;
  goto LAB_0016ed4d;
}

Assistant:

void SCSPDSP_Start(SCSPDSP *DSP)
{
	int i;
	DSP->Stopped=0;
	for(i=127;i>=0;--i)
	{
		UINT16 *IPtr=DSP->MPRO+i*4;

		if(IPtr[0]!=0 || IPtr[1]!=0 || IPtr[2]!=0 || IPtr[3]!=0)
			break;
	}
	DSP->LastStep=i+1;

}